

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O0

void __thiscall
ArgParser::add(ArgParser *this,uint *var,string *name,string *shortName,string *description,uint mn,
              uint mx,bool optional)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  undefined1 local_a8 [4];
  int ind;
  string local_78;
  string local_58;
  byte local_35;
  uint local_34;
  bool optional_local;
  string *psStack_30;
  uint mn_local;
  string *description_local;
  string *shortName_local;
  string *name_local;
  uint *var_local;
  ArgParser *this_local;
  
  local_35 = optional;
  local_34 = mn;
  psStack_30 = description;
  description_local = shortName;
  shortName_local = name;
  name_local = (string *)var;
  var_local = (uint *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)name);
  std::__cxx11::string::string((string *)&local_78,(string *)shortName);
  std::__cxx11::string::string((string *)local_a8,(string *)description);
  add(this,var,&local_58,&local_78,(string *)local_a8,(bool)(local_35 & 1));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  sVar3 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::size(&this->m_args);
  uVar1 = local_34;
  iVar2 = (int)sVar3 + -1;
  pvVar4 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[](&this->m_args,(long)iVar2)
  ;
  pvVar4->minUINT = uVar1;
  pvVar4 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[](&this->m_args,(long)iVar2)
  ;
  pvVar4->maxUINT = mx;
  pvVar4 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[](&this->m_args,(long)iVar2)
  ;
  pvVar4->checkRange = true;
  return;
}

Assistant:

void ArgParser::add(unsigned int *var,
                    std::string name, std::string shortName, std::string description,
                    unsigned int mn, unsigned int mx,
                    bool optional)
{
    add(var, name, shortName, description, optional);
    int ind = m_args.size() - 1;
    m_args[ind].minUINT = mn;
    m_args[ind].maxUINT = mx;
    m_args[ind].checkRange = true;
}